

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_idict_remove(stb_idict *a,stb_int32 k,stb_int32 *v)

{
  uint uVar1;
  uint local_30;
  uint s;
  uint n;
  uint h;
  stb_int32 *v_local;
  stb_int32 k_local;
  stb_idict *a_local;
  
  uVar1 = stb__stb_idict_hash(k);
  local_30 = uVar1 & a->mask;
  if (k == 1) {
    if (a->has_empty == '\0') {
      a_local._4_4_ = 0;
    }
    else {
      if (v != (stb_int32 *)0x0) {
        *v = a->ev;
      }
      a->has_empty = '\0';
      a_local._4_4_ = 1;
    }
  }
  else if (k == 3) {
    if (a->has_del == '\0') {
      a_local._4_4_ = 0;
    }
    else {
      if (v != (stb_int32 *)0x0) {
        *v = a->dv;
      }
      a->has_del = '\0';
      a_local._4_4_ = 1;
    }
  }
  else if (a->table[local_30].k == 1) {
    a_local._4_4_ = 0;
  }
  else {
    if (a->table[local_30].k != k) {
      do {
        local_30 = local_30 + (uVar1 + (uVar1 >> 6) + (uVar1 >> 0x13) | 1) & a->mask;
        if (a->table[local_30].k == 1) {
          return 0;
        }
      } while (a->table[local_30].k != k);
    }
    a->table[local_30].k = 3;
    a->count = a->count + -1;
    a->deleted = a->deleted + 1;
    if (v != (stb_int32 *)0x0) {
      *v = a->table[local_30].v;
    }
    if (a->count < a->shrink_threshhold) {
      stb__stb_idict_rehash(a,a->limit >> 1);
    }
    else if (a->delete_threshhold < a->deleted) {
      stb__stb_idict_rehash(a,a->limit);
    }
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}